

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O2

void speech_prog_oze(CHAR_DATA *mob,CHAR_DATA *ch,char *speech)

{
  short *psVar1;
  undefined2 uVar2;
  PC_DATA *pPVar3;
  bool bVar4;
  int iVar5;
  AFFECT_DATA *pAVar6;
  allocator<char> local_1412;
  allocator<char> local_1411;
  CHAR_DATA *mob_local;
  void *local_1408;
  void *local_1400;
  int local_13f4;
  CHAR_DATA *ch_local;
  string local_13e8;
  string local_13c8;
  string local_13a8;
  string local_1388;
  string local_1368;
  string local_1348;
  string local_1328;
  string local_1308;
  string local_12e8;
  string local_12c8;
  string local_12a8;
  string local_1288;
  string local_1268;
  string local_1248;
  char buf [4608];
  
  mob_local = mob;
  ch_local = ch;
  pAVar6 = affect_find(mob->affected,(int)gsn_greater_demon);
  if ((pAVar6 != (AFFECT_DATA *)0x0) && (pAVar6->owner == ch && pAVar6->owner != (CHAR_DATA *)0x0))
  {
    bVar4 = str_prefix("yes",speech);
    if (bVar4) {
      bVar4 = str_prefix("no",speech);
      if (bVar4) {
        do_say(mob,"The choice is a simple one, mortal.  Yes or no?");
        return;
      }
      sprintf(buf,"The abyss will not forget this treachery, %s.",ch->name);
      do_whisper(mob_local,buf);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1388,"speech_prog_oze",&local_1411);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13a8,"act_queue",&local_1412);
      local_1400 = (void *)0x0;
      local_1408 = (void *)0x0;
      local_13f4 = 0;
      CQueue::
      AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[86],char_data*&,decltype(nullptr),decltype(nullptr),int>
                (&RS.Queue,1,&local_1388,&local_13a8,act_queue,
                 (char (*) [86])
                 "The puddle of gore before you that was once a greater demon dissolves into the earth."
                 ,&mob_local,&local_1400,&local_1408,&local_13f4);
      std::__cxx11::string::~string((string *)&local_13a8);
      std::__cxx11::string::~string((string *)&local_1388);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13c8,"speech_prog_oze",(allocator<char> *)&local_1400);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13e8,"delay_extract",(allocator<char> *)&local_1408);
      CQueue::AddToQueue<void(*)(char_data*),char_data*&>
                (&RS.Queue,2,&local_13c8,&local_13e8,delay_extract,&mob_local);
      std::__cxx11::string::~string((string *)&local_13e8);
      std::__cxx11::string::~string((string *)&local_13c8);
      ch->pcdata->greaterdata[0] = -1;
    }
    else {
      WAIT_STATE(ch,0x24);
      act("Eyes flickering with nearly extinguished flame, Oze incants a phrase.",mob,(void *)0x0,
          (void *)0x0,0);
      sprintf(buf,"\'siphon\' %s",ch->name);
      do_cast(mob_local,buf);
      stop_fighting(mob_local,true);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1248,"speech_prog_oze",&local_1411);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1268,"act_queue",&local_1412);
      local_1400 = (void *)0x0;
      local_1408 = (void *)0x0;
      local_13f4 = 0;
      CQueue::
      AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[79],char_data*&,decltype(nullptr),decltype(nullptr),int>
                (&RS.Queue,3,&local_1248,&local_1268,act_queue,
                 (char (*) [79])
                 "Suddenly rejuvenated, Oze begins to growl deep in his torso of exposed organs.",
                 &mob_local,&local_1400,&local_1408,&local_13f4);
      std::__cxx11::string::~string((string *)&local_1268);
      std::__cxx11::string::~string((string *)&local_1248);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1288,"speech_prog_oze",(allocator<char> *)&local_1400);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_12a8,"do_say_queue",(allocator<char> *)&local_1408);
      CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[174]>
                (&RS.Queue,5,&local_1288,&local_12a8,do_say_queue,&mob_local,
                 (char (*) [174])
                 "I would say that your deed would be remembered... but as you were the one who put me here in the first place,  I doubt very much that you would wish it so.  I take my leave."
                );
      std::__cxx11::string::~string((string *)&local_12a8);
      std::__cxx11::string::~string((string *)&local_1288);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_12c8,"speech_prog_oze",&local_1411);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_12e8,"act_queue",&local_1412);
      local_1400 = (void *)0x0;
      local_1408 = (void *)0x0;
      local_13f4 = 0;
      CQueue::
      AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[81],char_data*&,decltype(nullptr),decltype(nullptr),int>
                (&RS.Queue,7,&local_12c8,&local_12e8,act_queue,
                 (char (*) [81])
                 "With a squelching sound, Oze thins into a gout of blood and shoots into the sky.",
                 &mob_local,&local_1400,&local_1408,&local_13f4);
      std::__cxx11::string::~string((string *)&local_12e8);
      std::__cxx11::string::~string((string *)&local_12c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1308,"speech_prog_oze",(allocator<char> *)&local_1400);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1328,"delay_extract",(allocator<char> *)&local_1408);
      CQueue::AddToQueue<void(*)(char_data*),char_data*&>
                (&RS.Queue,8,&local_1308,&local_1328,delay_extract,&mob_local);
      std::__cxx11::string::~string((string *)&local_1328);
      std::__cxx11::string::~string((string *)&local_1308);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1348,"speech_prog_oze",(allocator<char> *)&local_1400);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1368,"save_char_obj",(allocator<char> *)&local_1408);
      CQueue::AddToQueue<void(*)(char_data*),char_data*&>
                (&RS.Queue,8,&local_1348,&local_1368,save_char_obj,&ch_local);
      std::__cxx11::string::~string((string *)&local_1368);
      std::__cxx11::string::~string((string *)&local_1348);
      pPVar3 = ch_local->pcdata;
      pPVar3->greaterdata[0] = 2;
      iVar5 = skill_lookup("leech");
      pPVar3->learned[iVar5] = 1;
      psVar1 = &ch_local->pcdata->perm_hit;
      *psVar1 = *psVar1 + -0x46;
      uVar2 = ch_local->max_hit;
      ch_local->max_hit = uVar2 + -0x46;
      ch_local->hit = (int)(short)(uVar2 + -0x46);
    }
  }
  return;
}

Assistant:

void speech_prog_oze(CHAR_DATA *mob, CHAR_DATA *ch, char *speech)
{
	AFFECT_DATA *af = affect_find(mob->affected, gsn_greater_demon);
	char buf[MSL];

	if (!af || !af->owner)
		return;

	if (ch != af->owner)
		return;

	if (!str_prefix("yes", speech))
	{
		WAIT_STATE(ch, 3 * PULSE_VIOLENCE);

		act("Eyes flickering with nearly extinguished flame, Oze incants a phrase.", mob, 0, 0, TO_ROOM);

		sprintf(buf, "'siphon' %s", ch->name);
		do_cast(mob, buf);

		stop_fighting(mob, true);

		RS.Queue.AddToQueue(3, "speech_prog_oze", "act_queue", act_queue, "Suddenly rejuvenated, Oze begins to growl deep in his torso of exposed organs.", mob, nullptr, nullptr, TO_ROOM);
		RS.Queue.AddToQueue(5, "speech_prog_oze", "do_say_queue", do_say_queue, mob, "I would say that your deed would be remembered... but as you were the one who put me here in the first place,  I doubt very much that you would wish it so.  I take my leave.");
		RS.Queue.AddToQueue(7, "speech_prog_oze", "act_queue", act_queue, "With a squelching sound, Oze thins into a gout of blood and shoots into the sky.", mob, nullptr, nullptr, TO_ROOM);
		RS.Queue.AddToQueue(8, "speech_prog_oze", "delay_extract", delay_extract, mob);
		RS.Queue.AddToQueue(8, "speech_prog_oze", "save_char_obj", save_char_obj, ch);
		ch->pcdata->greaterdata[GREATER_OZE] = FAVOR_GRANTED;
		ch->pcdata->learned[skill_lookup("leech")] = 1;
		ch->pcdata->perm_hit -= 70;
		ch->max_hit -= 70;
		ch->hit = ch->max_hit;
		return;
	}

	if (!str_prefix("no", speech))
	{
		sprintf(buf, "The abyss will not forget this treachery, %s.", ch->name);
		do_whisper(mob, buf);

		RS.Queue.AddToQueue(1, "speech_prog_oze", "act_queue", act_queue, "The puddle of gore before you that was once a greater demon dissolves into the earth.", mob, nullptr, nullptr, TO_ROOM);
		RS.Queue.AddToQueue(2, "speech_prog_oze", "delay_extract", delay_extract, mob);
		ch->pcdata->greaterdata[GREATER_OZE] = FAVOR_FAILED;
		return;
	}

	do_say(mob, "The choice is a simple one, mortal.  Yes or no?");
}